

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O3

c_int osqp_warm_start_y(OSQPWorkspace *work,c_float *y)

{
  c_int cVar1;
  
  if (work != (OSQPWorkspace *)0x0) {
    if (work->settings->warm_start == 0) {
      work->settings->warm_start = 1;
    }
    prea_vec_copy(y,work->y,work->data->m);
    if (work->settings->scaling != 0) {
      vec_ew_prod(work->scaling->Einv,work->y,work->y,work->data->m);
      vec_mult_scalar(work->y,work->scaling->c,work->data->m);
    }
    return 0;
  }
  cVar1 = _osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR,"osqp_warm_start_y");
  return cVar1;
}

Assistant:

c_int osqp_warm_start_y(OSQPWorkspace *work, const c_float *y) {

  // Check if workspace has been initialized
  if (!work) return osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR);

  // Update warm_start setting to true
  if (!work->settings->warm_start) work->settings->warm_start = 1;

  // Copy primal variable into the iterate y
  prea_vec_copy(y, work->y, work->data->m);

  // Scale iterate
  if (work->settings->scaling) {
    vec_ew_prod(work->scaling->Einv, work->y, work->y, work->data->m);
    vec_mult_scalar(work->y, work->scaling->c, work->data->m);
  }

  return 0;
}